

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O1

void CPU::WDC65816::ProcessorStorageConstructor::brk_cop
               (AccessType param_1,bool param_2,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  MicroOp local_12 [10];
  
  local_12[0] = CycleFetchIncrementPC;
  if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*target->_M_invoker)((_Any_data *)target,local_12);
    local_12[1] = 0x37;
    if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*target->_M_invoker)((_Any_data *)target,local_12 + 1);
      local_12[2] = 0x13;
      if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
        (*target->_M_invoker)((_Any_data *)target,local_12 + 2);
        local_12[3] = 0x13;
        if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
          (*target->_M_invoker)((_Any_data *)target,local_12 + 3);
          local_12[4] = 0x13;
          if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
            (*target->_M_invoker)((_Any_data *)target,local_12 + 4);
            local_12[5] = 0x38;
            if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
              (*target->_M_invoker)((_Any_data *)target,local_12 + 5);
              local_12[6] = 0x13;
              if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
                (*target->_M_invoker)((_Any_data *)target,local_12 + 6);
                local_12[7] = 0xb;
                if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
                  (*target->_M_invoker)((_Any_data *)target,local_12 + 7);
                  local_12[8] = 10;
                  if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
                    (*target->_M_invoker)((_Any_data *)target,local_12 + 8);
                    local_12[9] = 0x2e;
                    if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
                      (*target->_M_invoker)((_Any_data *)target,local_12 + 9);
                      return;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::__throw_bad_function_call();
}

Assistant:

static void brk_cop(AccessType, bool, const std::function<void(MicroOp)> &target) {
		target(CycleFetchIncrementPC);		// Signature.

		target(OperationPrepareException);	// Populates the data buffer; this skips a micro-op if
											// in emulation mode.

		target(CyclePush);					// PBR	[skipped in emulation mode].
		target(CyclePush);					// PCH.
		target(CyclePush);					// PCL.

		target(OperationPickExceptionVector);	// Selects the exception's target; I've assumed the same
												// logic as a 6502 here — i.e. that some interrupts can
												// usurp the vectors of others.

		target(CyclePush);					// P.

		target(CycleFetchIncrementVector);	// AAVL.
		target(CycleFetchVector);			// AAVH.

		target(OperationPerform);			// Jumps to the vector address.
	}